

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  FILE *tmp;
  int tries;
  char *trunc_mode;
  char *mode;
  undefined4 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  byte in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  filename_t *in_stack_fffffffffffffe78;
  int last_errno;
  string *in_stack_fffffffffffffe80;
  filename_t *in_stack_fffffffffffffe88;
  string *this_00;
  filename_t local_138 [103];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  FILE *local_88;
  string local_70 [32];
  string local_50 [36];
  int local_2c;
  char *local_28;
  filename_t *local_20;
  byte local_11;
  string *local_10;
  file_helper *local_8;
  
  local_11 = (byte)__oflag & 1;
  local_10 = (string *)__file;
  local_8 = this;
  close(this,(int)__file);
  std::__cxx11::string::operator=((string *)&this->filename_,local_10);
  local_20 = (filename_t *)0x1c67e0;
  local_28 = "wb";
  local_2c = 0;
  do {
    if (this->open_tries_ <= local_2c) {
      os::filename_to_str(local_138);
      std::operator+((char *)in_stack_fffffffffffffe78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe77,
                              CONCAT16(in_stack_fffffffffffffe76,
                                       CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                                      )));
      std::operator+(in_stack_fffffffffffffe78,
                     (char *)CONCAT17(in_stack_fffffffffffffe77,
                                      CONCAT16(in_stack_fffffffffffffe76,
                                               CONCAT24(in_stack_fffffffffffffe74,
                                                        in_stack_fffffffffffffe70))));
      last_errno = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      __errno_location();
      throw_spdlog_ex((string *)in_stack_fffffffffffffe80,last_errno);
    }
    this_00 = local_70;
    std::__cxx11::string::string(this_00,local_10);
    os::dir_name(in_stack_fffffffffffffe88);
    os::create_dir((filename_t *)this_00);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    pcVar1 = local_28;
    if ((local_11 & 1) == 0) {
LAB_001a703c:
      in_stack_fffffffffffffe78 = (filename_t *)&this->fd_;
      in_stack_fffffffffffffe80 = local_10;
      in_stack_fffffffffffffe88 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,(char *)in_stack_fffffffffffffe88,&local_d1);
      in_stack_fffffffffffffe77 =
           os::fopen_s((FILE **)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (filename_t *)
                       CONCAT17(in_stack_fffffffffffffe77,
                                CONCAT16(in_stack_fffffffffffffe76,
                                         CONCAT24(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70))));
      in_stack_fffffffffffffe76 = in_stack_fffffffffffffe77 ^ 0xff;
      std::__cxx11::string::~string(local_d0);
      uVar3 = std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      if ((in_stack_fffffffffffffe76 & 1) != 0) {
        return (int)CONCAT71((int7)((ulong)uVar3 >> 8),in_stack_fffffffffffffe76);
      }
      os::sleep_for_millis
                (CONCAT13(in_stack_fffffffffffffe77,
                          CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74)));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,pcVar1,&local_a9);
      bVar2 = os::fopen_s((FILE **)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          (filename_t *)
                          CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,
                                            CONCAT24(in_stack_fffffffffffffe74,
                                                     in_stack_fffffffffffffe70))));
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      if (!bVar2) {
        fclose(local_88);
        goto LAB_001a703c;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate)
{
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    for (int tries = 0; tries < open_tries_; ++tries)
    {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate)
        {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode))
            {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode))
        {
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing", errno);
}